

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

string * __thiscall CLI::Option::get_flag_value(Option *this,string *name,string *input_value)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type __n;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  const_reference pvVar6;
  int *piVar7;
  int64_t iVar8;
  string *in_RCX;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  string *in_stack_00000010;
  int64_t val;
  ptrdiff_t ind;
  ptrdiff_t default_ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  string local_130 [32];
  long local_110;
  string *in_stack_ffffffffffffff08;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c1;
  string local_c0 [39];
  undefined1 local_99;
  string local_98 [56];
  string local_60 [32];
  size_type local_40;
  undefined1 local_36;
  undefined1 local_35 [20];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_21;
  
  local_21.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_8_ = in_RDX;
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffea8 = &local_21;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_35;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar3 != 0)) {
    in_stack_fffffffffffffe98 = (string *)&local_36;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if ((((*(byte *)(in_RSI + 0x24) & 1) != 0) &&
      (uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) == 0)) &&
     (_Var1 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78), !_Var1)) {
    ::std::__cxx11::string::string
              (local_60,(string *)
                        local_21.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._9_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RCX,in_stack_fffffffffffffea8);
    __n = detail::find_member(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00,
                              (bool)unaff_retaddr);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffe70);
    ::std::__cxx11::string::~string(local_60);
    local_40 = __n;
    if ((long)__n < 0) {
      bVar2 = ::std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      if (bVar2) {
        local_c1 = 1;
        uVar5 = __cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string
                  (local_c0,(string *)
                            local_21.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._9_8_);
        ArgumentMismatch::FlagOverride(in_stack_fffffffffffffe98);
        local_c1 = 0;
        __cxa_throw(uVar5,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
    else {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RSI + 0x58),__n);
      bVar2 = ::std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      if (bVar2) {
        _Var1 = ::std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if ((_Var1) && ((*(byte *)(in_RSI + 0x24e) & 1) != 0)) {
          ::std::__cxx11::string::string((string *)in_RDI,in_RCX);
          return in_RDI;
        }
        local_99 = 1;
        uVar5 = __cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string
                  (local_98,(string *)
                            local_21.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._9_8_);
        ArgumentMismatch::FlagOverride(in_stack_fffffffffffffe98);
        local_99 = 0;
        __cxa_throw(uVar5,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
    }
  }
  ::std::__cxx11::string::string
            (local_f0,(string *)
                      local_21.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._9_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RCX,in_stack_fffffffffffffea8);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          detail::find_member(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00,
                              (bool)unaff_retaddr);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe70);
  ::std::__cxx11::string::~string(local_f0);
  local_d0 = __rhs;
  uVar4 = ::std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) || (_Var1 = ::std::operator==(in_stack_fffffffffffffe80,__rhs), _Var1)) {
    if ((*(byte *)(in_RSI + 0x24a) & 1) == 0) {
      if ((long)local_d0 < 0) {
        local_198 = (string *)(in_RSI + 0xe8);
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(in_RSI + 0x58),(size_type)local_d0);
        local_198 = (string *)&pvVar6->second;
      }
      ::std::__cxx11::string::string((string *)in_RDI,local_198);
    }
    else {
      if ((long)local_d0 < 0) {
        psVar9 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_;
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(in_RSI + 0x58),(size_type)local_d0);
        psVar9 = &pvVar6->second;
      }
      ::std::__cxx11::string::string((string *)in_RDI,(string *)psVar9);
    }
  }
  else if ((long)local_d0 < 0) {
    ::std::__cxx11::string::string((string *)in_RDI,in_RCX);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RSI + 0x58),(size_type)local_d0);
    _Var1 = ::std::operator==(in_stack_fffffffffffffe80,__rhs);
    if (_Var1) {
      piVar7 = __errno_location();
      *piVar7 = 0;
      ::std::__cxx11::string::string(local_130,in_RCX);
      iVar8 = detail::to_flag_value(in_stack_ffffffffffffff08);
      ::std::__cxx11::string::~string(local_130);
      local_110 = iVar8;
      piVar7 = __errno_location();
      if (*piVar7 == 0) {
        if (local_110 == 1) {
          ::std::__cxx11::string::string
                    ((string *)in_RDI,
                     (string *)
                     &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                      falseString_abi_cxx11_);
        }
        else if (local_110 == -1) {
          ::std::__cxx11::string::string
                    ((string *)in_RDI,
                     (string *)
                     &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                      trueString_abi_cxx11_);
        }
        else {
          std::__cxx11::to_string((long)in_stack_fffffffffffffea8);
        }
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = 0;
        ::std::__cxx11::string::string((string *)in_RDI,in_RCX);
      }
    }
    else {
      ::std::__cxx11::string::string((string *)in_RDI,in_RCX);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_flag_value(const std::string &name,
                                                                std::string input_value) const {
    static const std::string trueString{"true"};
    static const std::string falseString{"false"};
    static const std::string emptyString{"{}"};
    // check for disable flag override_
    if(disable_flag_override_) {
        if(!((input_value.empty()) || (input_value == emptyString))) {
            auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
            if(default_ind >= 0) {
                // We can static cast this to std::size_t because it is more than 0 in this block
                if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                    if(input_value == default_str_ && force_callback_) {
                        return input_value;
                    }
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            } else {
                if(input_value != trueString) {
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            }
        }
    }
    auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
    if((input_value.empty()) || (input_value == emptyString)) {
        if(flag_like_) {
            return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
        }
        return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
    }
    if(ind < 0) {
        return input_value;
    }
    if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
        errno = 0;
        auto val = detail::to_flag_value(input_value);
        if(errno != 0) {
            errno = 0;
            return input_value;
        }
        return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
    }
    return input_value;
}